

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_> *
testing::internal::
ActionResultHolder<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>::
PerformDefaultAction<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&,std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&)>
          (FunctionMocker<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
           *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_> *this;
  __uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> local_70;
  __uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> local_48;
  
  this = (ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_> *)
         operator_new(0x30);
  FunctionMocker<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  ::PerformDefaultAction((Result *)&local_70,func_mocker,args,call_description);
  std::__uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>::__uniq_ptr_impl
            (&local_48,&local_70);
  ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>::
  ActionResultHolder(this,(Wrapper *)&local_48);
  std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *)&local_48);
  std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *)&local_70);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }